

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPSerializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BPSerializer::PutDimensionsRecord
          (BPSerializer *this,Dims *localDimensions,Dims *globalDimensions,Dims *offsets,
          vector<char,_std::allocator<char>_> *buffer)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  unsigned_long local_40;
  Dims *local_38;
  
  puVar2 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar1) {
    if ((globalDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (globalDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      puVar2 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar1 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar2 == puVar1) {
        return;
      }
      do {
        local_40 = *puVar2;
        helper::InsertToBuffer<unsigned_long>(buffer,&local_40,1);
        local_40 = local_40 & 0xffffffffffffff00;
        std::vector<char,_std::allocator<char>_>::_M_fill_insert
                  (buffer,(iterator)
                          (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish,0x10,(value_type *)&local_40);
        puVar2 = puVar2 + 1;
      } while (puVar2 != puVar1);
      return;
    }
    if (puVar2 == puVar1) {
      puVar2 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish == puVar2) {
        return;
      }
      uVar3 = 1;
      uVar4 = 0;
      do {
        local_40 = puVar2[uVar4];
        helper::InsertToBuffer<unsigned_long>(buffer,&local_40,1);
        local_40 = (globalDimensions->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
        helper::InsertToBuffer<unsigned_long>(buffer,&local_40,1);
        local_40 = local_40 & 0xffffffffffffff00;
        std::vector<char,_std::allocator<char>_>::_M_fill_insert
                  (buffer,(iterator)
                          (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish,8,(value_type *)&local_40);
        uVar4 = (ulong)uVar3;
        puVar2 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar3 = uVar3 + 1;
      } while (uVar4 < (ulong)((long)(localDimensions->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3
                              ));
      return;
    }
  }
  puVar2 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    uVar3 = 1;
    uVar4 = 0;
    local_38 = globalDimensions;
    do {
      local_40 = puVar2[uVar4];
      helper::InsertToBuffer<unsigned_long>(buffer,&local_40,1);
      local_40 = (local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
      helper::InsertToBuffer<unsigned_long>(buffer,&local_40,1);
      local_40 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
      helper::InsertToBuffer<unsigned_long>(buffer,&local_40,1);
      uVar4 = (ulong)uVar3;
      puVar2 = (localDimensions->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)(localDimensions->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void BPSerializer::PutDimensionsRecord(const Dims &localDimensions, const Dims &globalDimensions,
                                       const Dims &offsets, std::vector<char> &buffer) noexcept
{
    if (offsets.empty() && globalDimensions.empty())
    { // local array
        for (const auto localDimension : localDimensions)
        {
            helper::InsertU64(buffer, localDimension);
            buffer.insert(buffer.end(), 2 * sizeof(uint64_t), '\0');
        }
    }
    else if (offsets.empty())
    { // joined array has no offsets but has global dims
        for (unsigned int d = 0; d < localDimensions.size(); ++d)
        {
            helper::InsertU64(buffer, localDimensions[d]);
            helper::InsertU64(buffer, globalDimensions[d]);
            buffer.insert(buffer.end(), sizeof(uint64_t), '\0');
        }
    }
    else
    { // global array
        for (unsigned int d = 0; d < localDimensions.size(); ++d)
        {
            helper::InsertU64(buffer, localDimensions[d]);
            helper::InsertU64(buffer, globalDimensions[d]);
            helper::InsertU64(buffer, offsets[d]);
        }
    }
}